

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O3

int isobusfs_srv_rx_cg_cm(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  int *piVar1;
  uint8_t uVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  isobusfs_srv_client *piVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t buf_size;
  byte bVar11;
  ushort uVar12;
  long lVar13;
  char *pcVar14;
  undefined8 uVar15;
  uint8_t *__src;
  isobusfs_srv_client **ppiVar16;
  ulong uVar17;
  char isobusfs_volume_path [254];
  bool local_123c [4];
  ushort local_1238;
  undefined1 local_1236 [254];
  uint8_t local_1138 [256];
  char local_1038;
  undefined1 local_1037;
  undefined2 local_1036;
  undefined4 local_1034;
  
  bVar11 = msg->buf[0] & 0xf;
  if (bVar11 == 2) {
    if (priv->server_version < 3) goto LAB_00103e7f;
    memset(local_123c,0,0x104);
    local_123c[0] = true;
    uVar17 = (ulong)*(ushort *)(msg->buf + 2);
    __src = msg->buf + 4;
    isobusfs_log(4,"< rx volume status request. mode: %x, length: %d, name: %s",msg->buf[1],uVar17,
                 __src);
    piVar6 = isobusfs_srv_get_client_by_msg(priv,msg);
    if (piVar6 == (isobusfs_srv_client *)0x0) {
      pcVar14 = "can\'t find client";
LAB_00103fb3:
      uVar17 = 0;
      isobusfs_log(2,pcVar14);
      local_123c[3] = true;
      buf_size = 6;
LAB_00103fcc:
      memset(local_123c + buf_size,0xff,2 - uVar17);
      buf_size = 8;
    }
    else {
      if (uVar17 == 0) {
        __src = (uint8_t *)piVar6->current_dir;
        uVar17 = 0x1000;
      }
      pcVar14 = "can\'t extract volume name";
      if (((*__src != '\\') || (__src[1] != '\\')) || (__src[2] == '\0')) goto LAB_00103fb3;
      sVar9 = 3;
      if (uVar17 < 3) {
        sVar9 = uVar17;
      }
      memcpy(local_1138,__src,sVar9);
      uVar7 = 0;
      uVar8 = uVar7;
      if (uVar17 != 0) {
        do {
          uVar2 = __src[uVar7];
          uVar8 = uVar7;
          if ((uVar2 == '\0') || (uVar2 == '\\')) break;
          if (uVar7 == 0xfd) {
            uVar8 = 0xfd;
            break;
          }
          local_1138[uVar7] = uVar2;
          uVar7 = uVar7 + 1;
          uVar8 = uVar17;
        } while (uVar17 != uVar7);
      }
      local_1138[uVar8] = '\0';
      sVar9 = strlen((char *)local_1138);
      uVar12 = (ushort)sVar9;
      local_1238 = uVar12;
      memcpy(local_1236,local_1138,sVar9 + 1);
      wVar4 = isobusfs_path_to_linux_path
                        ((isobusfs_srv_priv_conflict *)priv,(char *)local_1138,0xfe,&local_1038,
                         0x1000);
      if (wVar4 < L'\0') {
        isobusfs_log(2,"can\'t convert %s path to linux path",local_1138);
LAB_0010414c:
        local_123c[3] = true;
      }
      else {
        iVar3 = isobusfs_cmn_dh_validate_dir_path(&local_1038,0);
        local_123c[3] = true;
        if (-1 < iVar3) {
          iVar3 = priv->volume_count;
          if ((long)iVar3 < 1) goto LAB_0010414c;
          ppiVar16 = priv->volumes[0].clients;
          lVar13 = 0;
          do {
            iVar5 = strncmp(priv->volumes[lVar13].name,(char *)local_1138,0xfe);
            if (iVar5 == 0) {
              local_123c[3] = true;
              if ((msg->buf[1] & 2) != 0) {
                if (priv->volumes[lVar13].removable != false) goto LAB_001041e2;
                goto LAB_0010414e;
              }
              if ((msg->buf[1] & 1) == 0) goto LAB_001041e2;
              lVar10 = 0;
              goto LAB_001041ac;
            }
            lVar13 = lVar13 + 1;
            ppiVar16 = ppiVar16 + 0xf0;
          } while (lVar13 != iVar3);
          local_123c[3] = true;
        }
      }
LAB_0010414e:
      uVar17 = sVar9 & 0xffff;
      buf_size = uVar17 + 6;
      if (uVar12 < 2) goto LAB_00103fcc;
      if (0xfffa < uVar12) {
        isobusfs_log(2,"volume status response too long");
        local_123c[3] = true;
        buf_size = 0x10000;
      }
    }
    iVar3 = isobusfs_srv_sendto(priv,msg,local_123c,buf_size);
    if (-1 < iVar3) {
      isobusfs_log(4,
                   "> tx volume status response. status: %d, error code: %d, name len: %d, name: %s"
                   ,local_123c[1],local_123c[3],local_1238);
      return 0;
    }
    pcVar14 = "can\'t send volume status response";
  }
  else {
    if (bVar11 != 1) {
      if ((msg->buf[0] & 0xf) == 0) {
        isobusfs_log(4,"< rx ccm version: %d",msg->buf[1]);
        return 0;
      }
LAB_00103e7f:
      isobusfs_srv_send_error(priv,msg,ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
      isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_cm",bVar11);
      return 0;
    }
    local_1038 = '\x01';
    local_1037 = (undefined1)priv->server_version;
    local_1036 = 0xff;
    local_1034 = 0xffffffff;
    iVar3 = isobusfs_srv_sendto(priv,msg,&local_1038,8);
    if (-1 < iVar3) {
      pcVar14 = "> tx property response";
      iVar3 = 0;
      uVar15 = 4;
      goto LAB_00104038;
    }
    pcVar14 = "can\'t send property response";
  }
  uVar15 = 2;
LAB_00104038:
  isobusfs_log(uVar15,pcVar14);
  return iVar3;
  while (lVar10 = lVar10 + 1, lVar10 != 0xed) {
LAB_001041ac:
    if (ppiVar16[lVar10] == piVar6) goto LAB_001041e2;
  }
  lVar10 = 0xed;
LAB_001041c2:
  if (*ppiVar16 != (isobusfs_srv_client *)0x0) goto code_r0x001041c9;
  *ppiVar16 = piVar6;
  piVar1 = &priv->volumes[lVar13].refcount;
  *piVar1 = *piVar1 + 1;
LAB_001041e2:
  local_123c[1] = 0 < priv->volumes[lVar13].refcount;
  local_123c[3] = false;
  goto LAB_0010414e;
code_r0x001041c9:
  ppiVar16 = ppiVar16 + 1;
  lVar10 = lVar10 + -1;
  if (lVar10 == 0) goto LAB_0010414e;
  goto LAB_001041c2;
}

Assistant:

int isobusfs_srv_rx_cg_cm(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	enum isobusfs_cm_cl_to_fs_function func =
		isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	/* Process the received function code and delegate to appropriate
	 * handlers
	 */
	switch (func) {
	case ISOBUSFS_CM_F_CC_MAINTENANCE:
		ret = isobusfs_srv_handle_ccm(priv, msg);
		break;
	case ISOBUSFS_CM_GET_FS_PROPERTIES:
		ret = isobusfs_srv_property_res(priv, msg);
		break;
	case ISOBUSFS_CM_VOLUME_STATUS_REQ:
		if (priv->server_version < 3)
			goto not_supported;

		ret = isobusfs_srv_volume_status_resp(priv, msg);
		break;
	default:
		goto not_supported;
	}

	return ret;

not_supported:
	/* Handle unsupported functions */
	isobusfs_srv_send_error(priv, msg, ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);

	pr_warn("%s: unsupported function: %i", __func__, func);

	/* Not a critical error */
	return 0;
}